

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O1

yajl_gen_status yajl_gen_map_close(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  char *__s;
  uint uVar3;
  size_t sVar4;
  yajl_gen_status yVar5;
  
  if (g->state[g->depth] == yajl_gen_error) {
    yVar5 = yajl_gen_in_error_state;
  }
  else if (g->state[g->depth] == yajl_gen_complete) {
    yVar5 = yajl_gen_generation_complete;
  }
  else {
    uVar3 = g->depth - 1;
    g->depth = uVar3;
    yVar5 = yajl_gen_generation_complete;
    if (uVar3 < 0x80) {
      if ((g->flags & 1) != 0) {
        (*g->print)(g->ctx,"\n",1);
      }
      uVar3 = g->depth;
      if ((ulong)g->state[uVar3] < 5) {
        g->state[uVar3] = *(yajl_gen_state *)(&DAT_001079b8 + (ulong)g->state[uVar3] * 4);
      }
      if ((((g->flags & 1) != 0) && (g->state[uVar3] != yajl_gen_map_val)) && (g->depth != 0)) {
        uVar3 = 0;
        do {
          p_Var1 = g->print;
          pvVar2 = g->ctx;
          __s = g->indentString;
          sVar4 = strlen(__s);
          (*p_Var1)(pvVar2,__s,sVar4 & 0xffffffff);
          uVar3 = uVar3 + 1;
        } while (uVar3 < g->depth);
      }
      (*g->print)(g->ctx,"}",1);
      yVar5 = yajl_gen_status_ok;
      if (((g->flags & 1) != 0) && (g->state[g->depth] == yajl_gen_complete)) {
        (*g->print)(g->ctx,"\n",1);
        yVar5 = yajl_gen_status_ok;
      }
    }
  }
  return yVar5;
}

Assistant:

yajl_gen_status
yajl_gen_map_close(yajl_gen g)
{
    ENSURE_VALID_STATE;
    DECREMENT_DEPTH;

    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    APPENDED_ATOM;
    INSERT_WHITESPACE;
    g->print(g->ctx, "}", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}